

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid2d_refinement_pattern.cc
# Opt level: O3

ostream * lf::refinement::operator<<(ostream *o,RefPat *refpat)

{
  long lVar1;
  char *pcVar2;
  
  switch(*refpat) {
  case rp_nil:
    pcVar2 = "rp_nil";
    lVar1 = 6;
    break;
  case rp_copy:
    pcVar2 = "rp_copy";
    lVar1 = 7;
    break;
  case rp_split:
    pcVar2 = "rp_split";
    lVar1 = 8;
    break;
  case rp_bisect:
    pcVar2 = "rp_bisect";
    lVar1 = 9;
    break;
  case rp_trisect:
    pcVar2 = "rp_trisect";
    goto LAB_0025ce30;
  case rp_trisect_left:
    pcVar2 = "rp_trisect_left";
    lVar1 = 0xf;
    break;
  case rp_quadsect:
    pcVar2 = "rp_quadsect";
    lVar1 = 0xb;
    break;
  case rp_threeedge:
    pcVar2 = "rp_threeedge";
    lVar1 = 0xc;
    break;
  case rp_regular:
    pcVar2 = "rp_regular";
LAB_0025ce30:
    lVar1 = 10;
    break;
  case rp_barycentric:
    pcVar2 = "rp_barycentric";
    lVar1 = 0xe;
    break;
  default:
    goto switchD_0025cdae_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar2,lVar1);
switchD_0025cdae_default:
  return o;
}

Assistant:

std::ostream &operator<<(std::ostream &o, const RefPat &refpat) {
  switch (refpat) {
    case rp_nil:
      o << "rp_nil";
      break;
    case rp_copy:
      o << "rp_copy";
      break;
    case rp_split:
      o << "rp_split";
      break;
    case rp_bisect:
      o << "rp_bisect";
      break;
    case rp_trisect:
      o << "rp_trisect";
      break;
    case rp_trisect_left:
      o << "rp_trisect_left";
      break;
    case rp_quadsect:
      o << "rp_quadsect";
      break;
    case rp_threeedge:
      o << "rp_threeedge";
      break;
    case rp_regular:
      o << "rp_regular";
      break;
    case rp_barycentric:
      o << "rp_barycentric";
      break;
  }
  return o;
}